

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O3

void vsencoding::__vseblocks_unpack6(uint32_t *out,uint32_t *in,uint32_t bs)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  uint uVar9;
  uint uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar16 [32];
  
  if (0x1f < bs + 0x1f) {
    auVar7 = vpmovsxbd_avx2(ZEXT816(0xa10161c02080e14));
    auVar15._8_4_ = 0x3f;
    auVar15._0_8_ = 0x3f0000003f;
    auVar15._12_4_ = 0x3f;
    auVar16._16_4_ = 0x3f;
    auVar16._0_16_ = auVar15;
    auVar16._20_4_ = 0x3f;
    auVar16._24_4_ = 0x3f;
    auVar16._28_4_ = 0x3f;
    auVar3 = vpmovsxbd_avx(ZEXT416(0x60c1218));
    auVar4 = vpmovsxbd_avx(ZEXT416(0x5010401));
    auVar5 = vpmovsxbd_avx(ZEXT416(0x204));
    auVar6 = vpmovsxbd_avx(ZEXT416(0x3c30));
    auVar8 = vpmovsxbd_avx2(ZEXT816(0x1e040a10161c0208));
    uVar10 = bs + 0x1f >> 5;
    do {
      uVar1 = *(ulong *)in;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = uVar1;
      auVar11 = vpshufd_avx(auVar11,0x50);
      *out = (uint)(uVar1 >> 0x1a) & 0x3f;
      auVar20 = vpermq_avx2(ZEXT1632(auVar11),0x50);
      uVar9 = (uint)(uVar1 >> 0x20);
      auVar19 = vpsrlvd_avx2(auVar20,auVar7);
      auVar14 = vpbroadcastd_avx512vl();
      auVar20 = vpand_avx2(auVar19,auVar16);
      auVar19 = vpor_avx2(auVar14,auVar19);
      auVar20 = vpblendd_avx2(auVar20,auVar19,0x10);
      *(undefined1 (*) [32])(out + 1) = auVar20;
      out[9] = uVar9 >> 4 & 0x3f;
      uVar1 = *(ulong *)((long)in + 8);
      auVar11 = vpbroadcastd_avx512vl();
      auVar12 = vpbroadcastd_avx512vl();
      auVar11 = vpsrlvd_avx2(auVar11,auVar3);
      uVar2 = *(ulong *)((long)in + 0x10);
      in = (uint32_t *)((long)in + 0x18);
      auVar12 = vpsrlvd_avx2(auVar12,auVar7._0_16_);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = uVar1;
      auVar19._0_16_ = ZEXT116(0) * auVar13 + ZEXT116(1) * auVar11;
      auVar19._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar13;
      auVar21._0_8_ = auVar12._0_8_;
      auVar21._8_8_ = auVar21._0_8_;
      auVar21._16_8_ = auVar21._0_8_;
      auVar21._24_8_ = auVar21._0_8_;
      out[10] = (uVar9 & 0xf) << 2 | (uint)uVar1 >> 0x1e;
      auVar20 = vpblendd_avx2(auVar19,auVar21,0xc0);
      auVar19 = vpsrld_avx2(auVar19,0x1a);
      auVar20 = vpand_avx2(auVar20,auVar16);
      auVar20 = vpblendd_avx2(auVar20,auVar19,0x20);
      *(undefined1 (*) [32])(out + 0xb) = auVar20;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = uVar2;
      auVar11 = vshufps_avx(auVar13,auVar17,5);
      auVar12._8_8_ = 0;
      auVar12._0_8_ = uVar1;
      auVar13 = vpermt2d_avx512vl(auVar12,auVar4,auVar17);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = uVar2;
      auVar12 = vshufps_avx(auVar18,auVar18,0x40);
      auVar20._16_16_ = auVar12;
      auVar20._0_16_ = auVar11;
      auVar19 = vpsrlvd_avx2(auVar20,auVar8);
      auVar11 = vpsllvd_avx2(auVar13,auVar5);
      auVar20 = vpand_avx2(auVar19,auVar16);
      auVar11 = vpand_avx(auVar11,auVar6);
      auVar14._0_8_ = auVar11._0_8_;
      auVar14._8_8_ = auVar14._0_8_;
      auVar14._16_8_ = auVar14._0_8_;
      auVar14._24_8_ = auVar14._0_8_;
      auVar19 = vpor_avx2(auVar19,auVar14);
      auVar20 = vpblendd_avx2(auVar20,auVar19,0x84);
      *(undefined1 (*) [32])(out + 0x13) = auVar20;
      auVar11 = vpbroadcastd_avx512vl();
      auVar11 = vpsrlvd_avx2(auVar11,auVar3);
      auVar11 = vpand_avx(auVar11,auVar15);
      *(undefined1 (*) [16])(out + 0x1b) = auVar11;
      out[0x1f] = (uint)(uVar2 >> 0x20) & 0x3f;
      out = out + 0x20;
      uVar10 = uVar10 - 1;
    } while (uVar10 != 0);
  }
  return;
}

Assistant:

void __vseblocks_unpack6(uint32_t *__restrict__ out,
                         const uint32_t *__restrict__ in, uint32_t bs) {
  for (bs = (bs + 31U) / 32U; bs > 0; out += 32, in += 6, --bs) {
    out[0] = in[0] >> 26;
    out[1] = (in[0] >> 20) & 0x3f;
    out[2] = (in[0] >> 14) & 0x3f;
    out[3] = (in[0] >> 8) & 0x3f;
    out[4] = (in[0] >> 2) & 0x3f;
    out[5] = (in[0] << 4) & 0x3f;
    out[5] |= in[1] >> 28;
    out[6] = (in[1] >> 22) & 0x3f;
    out[7] = (in[1] >> 16) & 0x3f;
    out[8] = (in[1] >> 10) & 0x3f;
    out[9] = (in[1] >> 4) & 0x3f;
    out[10] = (in[1] << 2) & 0x3f;
    out[10] |= in[2] >> 30;
    out[11] = (in[2] >> 24) & 0x3f;
    out[12] = (in[2] >> 18) & 0x3f;
    out[13] = (in[2] >> 12) & 0x3f;
    out[14] = (in[2] >> 6) & 0x3f;
    out[15] = in[2] & 0x3f;
    out[16] = in[3] >> 26;
    out[17] = (in[3] >> 20) & 0x3f;
    out[18] = (in[3] >> 14) & 0x3f;
    out[19] = (in[3] >> 8) & 0x3f;
    out[20] = (in[3] >> 2) & 0x3f;
    out[21] = (in[3] << 4) & 0x3f;
    out[21] |= in[4] >> 28;
    out[22] = (in[4] >> 22) & 0x3f;
    out[23] = (in[4] >> 16) & 0x3f;
    out[24] = (in[4] >> 10) & 0x3f;
    out[25] = (in[4] >> 4) & 0x3f;
    out[26] = (in[4] << 2) & 0x3f;
    out[26] |= in[5] >> 30;
    out[27] = (in[5] >> 24) & 0x3f;
    out[28] = (in[5] >> 18) & 0x3f;
    out[29] = (in[5] >> 12) & 0x3f;
    out[30] = (in[5] >> 6) & 0x3f;
    out[31] = in[5] & 0x3f;
  }
}